

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void magic_map_background(xchar x,xchar y,int show)

{
  undefined8 uStack_2c;
  rm tmp_loc;
  rm *loc;
  int cmap;
  int show_local;
  xchar y_local;
  xchar x_local;
  
  loc._4_4_ = back_to_cmap(level,x,y);
  tmp_loc._4_8_ = level->locations[x] + y;
  if ((*(uint *)&(level->flags).field_0x8 >> 0xe & 1) == 0) {
    uStack_2c = *(undefined8 *)tmp_loc._4_8_;
    tmp_loc._0_4_ = *(undefined4 *)&((rm *)tmp_loc._4_8_)->field_0x8;
    tmp_loc._4_8_ = &uStack_2c;
  }
  if (((viz_array[y][x] & 2U) == 0) && ((*(uint *)(tmp_loc._4_8_ + 6) >> 0xb & 1) == 0)) {
    if ((*(char *)(tmp_loc._4_8_ + 4) == '\x19') && (loc._4_4_ == 0xf)) {
      loc._4_4_ = 0x10;
    }
    else if ((*(char *)(tmp_loc._4_8_ + 4) == '\x18') && (loc._4_4_ == 0xe)) {
      loc._4_4_ = 0xd;
    }
  }
  *(uint *)tmp_loc._4_8_ = *(uint *)tmp_loc._4_8_ & 0xffffffc0 | loc._4_4_ & 0x3f;
  if ((((loc._4_4_ == 0x19) || (loc._4_4_ == 0x1a)) || (loc._4_4_ == 0x1b)) || (loc._4_4_ == 0x1c))
  {
    *(uint *)(tmp_loc._4_8_ + 6) = *(uint *)(tmp_loc._4_8_ + 6) & 0xfffffffe | 1;
    *(uint *)(tmp_loc._4_8_ + 6) = *(uint *)(tmp_loc._4_8_ + 6) & 0xfffffffd | 2;
  }
  else {
    *(uint *)(tmp_loc._4_8_ + 6) = *(uint *)(tmp_loc._4_8_ + 6) & 0xfffffffe;
    *(uint *)(tmp_loc._4_8_ + 6) = *(uint *)(tmp_loc._4_8_ + 6) & 0xfffffffd;
  }
  if (show != 0) {
    dbuf_set(level,(int)x,(int)y,(rm *)tmp_loc._4_8_,loc._4_4_,0,0,0,0,0,0,0,0,0);
  }
  return;
}

Assistant:

void magic_map_background(xchar x, xchar y, int show)
{
    int cmap = back_to_cmap(level, x, y);	/* assumes hero can see x,y */
    struct rm *loc = &level->locations[x][y];
    struct rm tmp_loc;

    if (!level->flags.hero_memory) {
	tmp_loc = *loc;
	loc = &tmp_loc;
    }

    /*
     * Correct for out of sight lit corridors and rooms that the hero
     * doesn't remember as lit.
     */
    if (!cansee(x,y) && !loc->waslit) {
	/* Floor spaces are dark if unlit.  Corridors are dark if unlit. */
	if (loc->typ == ROOM && cmap == S_room)
	    cmap = S_darkroom;
	else if (loc->typ == CORR && cmap == S_litcorr)
	    cmap = S_corr;
    }
    loc->mem_bg = cmap;
    if (cmap == S_vodoor || cmap == S_hodoor ||
	cmap == S_vcdoor || cmap == S_hcdoor) {
	loc->mem_door_l = 1;
	loc->mem_door_t = 1;
    } else {
	loc->mem_door_l = 0;
	loc->mem_door_t = 0;
    }

    if (show)
	dbuf_set(level, x, y, loc, cmap, 0, 0, 0, 0, 0, 0, 0, 0, 0);
}